

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

archive_string * archive_string_ensure(archive_string *as,size_t s)

{
  char *pcVar1;
  int *piVar2;
  ulong in_RSI;
  archive_string *in_RDI;
  size_t new_length;
  char *p;
  ulong local_28;
  archive_string *local_8;
  
  local_8 = in_RDI;
  if ((in_RDI->s == (char *)0x0) || (in_RDI->buffer_length < in_RSI)) {
    if (in_RDI->buffer_length < 0x20) {
      local_28 = 0x20;
    }
    else if (in_RDI->buffer_length < 0x2000) {
      local_28 = in_RDI->buffer_length + in_RDI->buffer_length;
    }
    else {
      local_28 = in_RDI->buffer_length + (in_RDI->buffer_length >> 2);
      if (local_28 < in_RDI->buffer_length) {
        archive_string_free((archive_string *)0x1118cb);
        piVar2 = __errno_location();
        *piVar2 = 0xc;
        return (archive_string *)0x0;
      }
    }
    if (local_28 < in_RSI) {
      local_28 = in_RSI;
    }
    pcVar1 = (char *)realloc(in_RDI->s,local_28);
    if (pcVar1 == (char *)0x0) {
      archive_string_free((archive_string *)0x111921);
      piVar2 = __errno_location();
      *piVar2 = 0xc;
      local_8 = (archive_string *)0x0;
    }
    else {
      in_RDI->s = pcVar1;
      in_RDI->buffer_length = local_28;
    }
  }
  return local_8;
}

Assistant:

struct archive_string *
archive_string_ensure(struct archive_string *as, size_t s)
{
	char *p;
	size_t new_length;

	/* If buffer is already big enough, don't reallocate. */
	if (as->s && (s <= as->buffer_length))
		return (as);

	/*
	 * Growing the buffer at least exponentially ensures that
	 * append operations are always linear in the number of
	 * characters appended.  Using a smaller growth rate for
	 * larger buffers reduces memory waste somewhat at the cost of
	 * a larger constant factor.
	 */
	if (as->buffer_length < 32)
		/* Start with a minimum 32-character buffer. */
		new_length = 32;
	else if (as->buffer_length < 8192)
		/* Buffers under 8k are doubled for speed. */
		new_length = as->buffer_length + as->buffer_length;
	else {
		/* Buffers 8k and over grow by at least 25% each time. */
		new_length = as->buffer_length + as->buffer_length / 4;
		/* Be safe: If size wraps, fail. */
		if (new_length < as->buffer_length) {
			/* On failure, wipe the string and return NULL. */
			archive_string_free(as);
			errno = ENOMEM;/* Make sure errno has ENOMEM. */
			return (NULL);
		}
	}
	/*
	 * The computation above is a lower limit to how much we'll
	 * grow the buffer.  In any case, we have to grow it enough to
	 * hold the request.
	 */
	if (new_length < s)
		new_length = s;
	/* Now we can reallocate the buffer. */
	p = (char *)realloc(as->s, new_length);
	if (p == NULL) {
		/* On failure, wipe the string and return NULL. */
		archive_string_free(as);
		errno = ENOMEM;/* Make sure errno has ENOMEM. */
		return (NULL);
	}

	as->s = p;
	as->buffer_length = new_length;
	return (as);
}